

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velodyne.h
# Opt level: O0

int ProcessRawDataVelodyne
              (VELODYNE *pVelodyne,u_char *data,uint32_t data_len,double *pDistances,double *pAngles
              ,double *pElevation)

{
  u_char uVar1;
  u_char uVar2;
  double dVar3;
  double dVar4;
  double timeOffset;
  uchar intensity;
  double distance;
  unsigned_short rawDistance;
  double elevation;
  int laserID;
  int dataBlockIndex;
  int j;
  double azimuth;
  int local_60;
  unsigned_short rawAzimuth;
  unsigned_short flag;
  int i;
  int dual_mode;
  uint timeStamp;
  uchar returnMode;
  uchar productID;
  uchar *dataPacket;
  int k;
  double *pElevation_local;
  double *pAngles_local;
  double *pDistances_local;
  uint32_t data_len_local;
  u_char *data_local;
  VELODYNE *pVelodyne_local;
  
  dataPacket._4_4_ = 0;
  local_60 = 0;
  while( true ) {
    if (0xb < local_60) {
      return 0;
    }
    if (CONCAT11(data[local_60 * 100],data[local_60 * 100 + 1]) != -0x12) break;
    uVar1 = data[local_60 * 100 + 3];
    uVar2 = data[local_60 * 100 + 2];
    for (laserID = 0; laserID < 0x20; laserID = laserID + 1) {
      dVar3 = ((double)CONCAT11(data[local_60 * 100 + 5 + laserID * 3],
                                data[local_60 * 100 + 4 + laserID * 3]) * 2.0) / 1000.0;
      if (laserID % 0x10 == pVelodyne->DefaultLaserID) {
        dVar4 = fmod_2PI_deg2rad((double)(laserID % 0x10) * pVelodyne->step_elevation +
                                 pVelodyne->min_elevation);
        *pElevation = dVar4;
        dVar4 = fmod_2PI_pos_deg2rad((double)CONCAT11(uVar1,uVar2) / 100.0);
        pAngles[dataPacket._4_4_] = dVar4;
        if (pVelodyne->bDistanceProjectionWithElevation == 0) {
          pDistances[dataPacket._4_4_] = dVar3;
        }
        else {
          dVar4 = cos(*pElevation);
          pDistances[dataPacket._4_4_] = dVar3 * dVar4;
        }
        dataPacket._4_4_ = dataPacket._4_4_ + 1;
      }
    }
    local_60 = local_60 + 1;
  }
  printf("Error reading data from a Velodyne : Invalid data packet. \n");
  return 1;
}

Assistant:

int ProcessRawDataVelodyne(VELODYNE* pVelodyne, const u_char* data, uint32_t data_len, double* pDistances, double* pAngles, double* pElevation)
{
	int k = 0;

	// Assuming buffer contains the received UDP packet.
	unsigned char* dataPacket = (unsigned char*)data;

	// Parse the data packet.
	unsigned char productID = dataPacket[data_len-1];
	unsigned char returnMode = dataPacket[data_len-2];
	unsigned int timeStamp = (dataPacket[data_len-3] << 24) | (dataPacket[data_len-4] << 16) | (dataPacket[data_len-5] << 8) | dataPacket[data_len-6];

	//if (productID != 0x22) {
	//	printf("Error reading data from a Velodyne : Unsupported productID. \n");
	//	return EXIT_FAILURE;
	//}

	int dual_mode = (returnMode == 0x39);
	//if (dual_mode) {
	//	printf("Error reading data from a Velodyne : Unsupported mode. \n");
	//	return EXIT_FAILURE;
	//}

	//memset(pAngles, 0, NB_MEASUREMENTS_VELODYNE);
	//memset(pDistances, 0, NB_MEASUREMENTS_VELODYNE);
	for (int i = 0; i < 12; i++) { // 12 blocks in one data packet.
		unsigned short flag = (dataPacket[i*100] << 8) | dataPacket[i*100 + 1]; // Each block starts with a flag.
		if (flag != 0xFFEE) {
			printf("Error reading data from a Velodyne : Invalid data packet. \n");
			return EXIT_FAILURE;
		}
		unsigned short rawAzimuth = (dataPacket[i*100 + 3] << 8) | dataPacket[i*100 + 2]; // Followed by azimuth data.
		double azimuth = rawAzimuth / 100.0; // Convert to degrees.

		for (int j = 0; j < 32; j++) { // Each block contains 32 data points.
			int dataBlockIndex = (dual_mode)? (i - (i % 2)) + (j / 16): (i * 2) + (j / 16); // From documentation.
			int laserID = j % 16; // There are 16 lasers

			// Assuming firing alternance, symetry...
			double elevation = pVelodyne->min_elevation+(laserID*pVelodyne->step_elevation);

			unsigned short rawDistance = (dataPacket[i*100 + 5 + j*3] << 8) | dataPacket[i*100 + 4 + j*3]; // Distance data.
			//if (rawDistance == 0) // Invalid data.
			//	continue;

			double distance = ((double)rawDistance)*2.0 / 1000.0; // Convert to meters.
			unsigned char intensity = dataPacket[i*100 + 6 + j*3]; // Intensity data.

			double timeOffset = (55.296 * dataBlockIndex) + (2.304 * laserID); // From documentation.

			//std::cout << "Laser ID: " << laserID << "Elevation: " << elevation << ", Azimuth: " << azimuth << ", Distance: " << distance << ", Intensity: " << int(intensity) << ", TimeStamp: " << std::fixed << timeStamp+timeOffset << std::endl;
			

			// TODO: there is a concept of "Vertical Correction" that should be applied...


			if (laserID == pVelodyne->DefaultLaserID)
			{
				*pElevation = fmod_2PI_deg2rad(elevation); // Convert in rad.
				pAngles[k] = fmod_2PI_pos_deg2rad(azimuth); // Convert in rad.
				if (pVelodyne->bDistanceProjectionWithElevation)
				{
					pDistances[k] = distance*cos(*pElevation); // Convert in m.
				}
				else 
				{
					pDistances[k] = distance; // Convert in m.
				}
				k++;
			}
			UNREFERENCED_PARAMETER(intensity);
			UNREFERENCED_PARAMETER(timeOffset);
		}
	}

	UNREFERENCED_PARAMETER(timeStamp);
	UNREFERENCED_PARAMETER(productID);

	return EXIT_SUCCESS;	
}